

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O3

void __thiscall
pstack::Procman::CoreProcess::CoreProcess(CoreProcess *this,Context *ctx,sptr *exec,sptr *core)

{
  _Rb_tree_header *p_Var1;
  prpsinfo_t *object;
  pointer pNVar2;
  pointer pNVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 this_00;
  int iVar6;
  mapped_type *pmVar7;
  CoreProcess *pCVar8;
  undefined1 auStack_278 [8];
  elf_prstatus task;
  iterator __end2;
  long local_118;
  long local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  CoreProcess *local_e8;
  iterator __begin2;
  long local_d8;
  long local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  undefined1 local_a8 [8];
  NoteDesc note;
  Reader *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  sptr local_58;
  vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_> *local_48;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  *local_40;
  CoreProcess *local_38;
  
  (this->super_Process)._vptr_Process = (_func_int **)&PTR_findRDebugAddr_0013ee58;
  local_58.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (exec->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (exec->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (exec->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (exec->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_e8 = this;
  std::__shared_ptr<pstack::Procman::CoreReader,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pstack::Procman::CoreReader>,pstack::Procman::CoreProcess*,std::shared_ptr<pstack::Elf::Object>&>
            ((__shared_ptr<pstack::Procman::CoreReader,(__gnu_cxx::_Lock_policy)2> *)auStack_278,
             (_Sp_alloc_shared_tag<std::allocator<pstack::Procman::CoreReader>_>)&task.pr_fpvalid,
             &local_e8,core);
  this_00 = task.pr_info._0_8_;
  note.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_278;
  auStack_278 = (undefined1  [8])0x0;
  task.pr_info.si_signo = 0;
  task.pr_info.si_code = 0;
  local_38 = this;
  Process::Process(&this->super_Process,ctx,&local_58,
                   (sptr *)&note.io.
                            super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  if (this_00 != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  pCVar8 = local_38;
  if (task.pr_info._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)task.pr_info._0_8_);
  }
  if (local_58.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (pCVar8->super_Process)._vptr_Process = (_func_int **)&PTR_findRDebugAddr_0013ee58;
  local_48 = &pCVar8->notes;
  (pCVar8->notes).super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar8->notes).super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_38->notes).
  super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = &local_38->lwpToPrStatusIdx;
  p_Var1 = &(local_38->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header;
  (local_38->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (local_38->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (local_38->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (local_38->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  memset(&(local_38->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x90);
  pCVar8 = local_38;
  (local_38->coreImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (core->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var5 = (core->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (core->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_38->coreImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  (local_38->coreImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  (core->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  pstack::Elf::Notes::begin();
  pstack::Elf::Notes::end();
  object = &pCVar8->prpsinfo;
  while (((___begin2 != ___end2 || (local_d8 != local_118)) || (local_d0 != local_110))) {
    Elf::Notes::iterator::operator*((NoteDesc *)local_a8,(iterator *)&local_e8);
    pstack::Elf::NoteDesc::name_abi_cxx11_();
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_278,"CORE");
    if (auStack_278 != (undefined1  [8])&task.pr_info.si_errno) {
      operator_delete((void *)auStack_278,task._8_8_ + 1);
    }
    if (iVar6 == 0) {
      if (note.note.n_namesz == 1) {
        pstack::Elf::NoteDesc::data();
        Reader::readObj<elf_prstatus>(local_70,0,(elf_prstatus *)auStack_278,1);
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
        }
        pNVar2 = (pCVar8->notes).
                 super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pNVar3 = (pCVar8->notes).
                 super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pmVar7 = std::
                 map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                 ::operator[](local_40,(key_type *)&task.pr_sighold);
        *pmVar7 = (long)pNVar3 - (long)pNVar2 >> 5;
        pCVar8 = local_38;
      }
      else if (note.note.n_namesz == 3) {
        pstack::Elf::NoteDesc::data();
        Reader::readObj<elf_prpsinfo>((Reader *)auStack_278,0,object,1);
        if (task.pr_info._0_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)task.pr_info._0_8_);
        }
      }
    }
    std::vector<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>::push_back
              (local_48,(NoteDesc *)local_a8);
    if (note.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 note.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
    }
    pstack::Elf::Notes::iterator::operator++((iterator *)&local_e8);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  return;
}

Assistant:

CoreProcess::CoreProcess(Context &ctx, Elf::Object::sptr exec, Elf::Object::sptr core)
   : Process(ctx, std::move(exec), std::make_shared<CoreReader>(this, core))
     , prpsinfo{}
     , coreImage(std::move(core))
{
   for (auto note : coreImage->notes()) {
      if (note.name() == "CORE") {
         switch  (note.type() ) {
            case NT_PRSTATUS: {
               // for NT_PRSTATUS notes, mark the index of the current note in our
               // vector as the start of the notes for that LWP. When looking
               // for an LWP-related note, we start at the index for that LWPs
               // NT_PRSTATUS, and consider it a failure if we reach another
               // NT_PRSTATUS or the end of the list.
               auto task = note.data()->readObj<prstatus_t>(0);
               lwpToPrStatusIdx[task.pr_pid] = notes.size();
               break;
            }
            case NT_PRPSINFO: {
               note.data()->readObj(0, &prpsinfo); // hold on to a copy of this
               break;
            }
            default:
               break;
         }
      }
      notes.push_back( note );
   }
}